

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

string * common_sampler_print_abi_cxx11_(common_sampler *gsmpl)

{
  int iVar1;
  int iVar2;
  char *__rhs;
  long in_RSI;
  string *in_RDI;
  llama_sampler *smpl;
  int i;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string local_70 [32];
  string local_50 [32];
  undefined8 local_30;
  int local_28;
  allocator<char> local_12;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  __a = &local_12;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
  std::allocator<char>::~allocator(&local_12);
  for (local_28 = 0; iVar1 = local_28,
      iVar2 = llama_sampler_chain_n(*(undefined8 *)(local_10 + 0x128)), iVar1 < iVar2;
      local_28 = local_28 + 1) {
    local_30 = llama_sampler_chain_get(*(undefined8 *)(local_10 + 0x128),local_28);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__a);
    __rhs = (char *)llama_sampler_name(local_30);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  }
  return in_RDI;
}

Assistant:

std::string common_sampler_print(const struct common_sampler * gsmpl) {
    std::string result = "logits ";

    for (int i = 0; i < llama_sampler_chain_n(gsmpl->chain); i++) {
        const auto * smpl = llama_sampler_chain_get(gsmpl->chain, i);
        result += std::string("-> ") + llama_sampler_name(smpl) + " ";
    }

    return result;
}